

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

int Acb_NtkWindow2Solver
              (sat_solver *pSat,Cnf_Dat_t *pCnf,Vec_Int_t *vFlip,int PivotVar,int nDivs,int nTimes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_58;
  int local_54;
  int BaseC;
  int BaseB;
  int BaseA;
  int nRounds;
  int nGroups;
  int Test;
  int RetValue;
  int i;
  int n;
  int nTimes_local;
  int nDivs_local;
  int PivotVar_local;
  Vec_Int_t *vFlip_local;
  Cnf_Dat_t *pCnf_local;
  sat_solver *pSat_local;
  
  iVar3 = **pCnf->pClauses;
  if (nTimes < 3) {
    local_54 = nTimes + -1;
    local_58 = nTimes + -1;
  }
  else {
    local_54 = 2;
    local_58 = nTimes;
  }
  iVar2 = sat_solver_nvars(pSat);
  if (iVar2 != 0) {
    __assert_fail("sat_solver_nvars(pSat) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                  ,0x12f,
                  "int Acb_NtkWindow2Solver(sat_solver *, Cnf_Dat_t *, Vec_Int_t *, int, int, int)")
    ;
  }
  sat_solver_setnvars(pSat,nTimes * pCnf->nVars + local_54 * nDivs + 2);
  if (((nTimes != 1) && (nTimes != 2)) && (nTimes != 6)) {
    __assert_fail("nTimes == 1 || nTimes == 2 || nTimes == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                  ,0x131,
                  "int Acb_NtkWindow2Solver(sat_solver *, Cnf_Dat_t *, Vec_Int_t *, int, int, int)")
    ;
  }
  for (RetValue = 0; RetValue < nTimes; RetValue = RetValue + 1) {
    if ((RetValue & 1U) != 0) {
      Cnf_DataLiftAndFlipLits(pCnf,-pCnf->nVars,vFlip);
    }
    for (Test = 0; Test < pCnf->nClauses; Test = Test + 1) {
      iVar2 = sat_solver_addclause(pSat,pCnf->pClauses[Test],pCnf->pClauses[Test + 1]);
      if (iVar2 == 0) {
        printf("Error: SAT solver became UNSAT at a wrong place.\n");
      }
    }
    if ((RetValue & 1U) != 0) {
      Cnf_DataLiftAndFlipLits(pCnf,pCnf->nVars,vFlip);
    }
    if (RetValue < nTimes + -1) {
      Cnf_DataLift(pCnf,pCnf->nVars);
    }
    else if (RetValue != 0) {
      Cnf_DataLift(pCnf,-(nTimes + -1) * pCnf->nVars);
    }
  }
  if (iVar3 == **pCnf->pClauses) {
    for (RetValue = 0; RetValue < local_58; RetValue = RetValue + 1) {
      iVar3 = pCnf->nVars;
      iVar2 = pCnf->nVars;
      iVar1 = pCnf->nVars;
      for (Test = 0; Test < nDivs; Test = Test + 1) {
        sat_solver_add_buffer_enable
                  (pSat,RetValue * iVar3 + Test,((RetValue + 1) % nTimes) * iVar2 + Test,
                   nTimes * iVar1 + (RetValue & 1U) * nDivs + Test,0);
      }
    }
    iVar3 = sat_solver_simplify(pSat);
    if (iVar3 == 0) {
      printf("Error: SAT solver became UNSAT at a wrong place.\n");
    }
    return 1;
  }
  __assert_fail("Test == pCnf->pClauses[0][0]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                ,0x140,
                "int Acb_NtkWindow2Solver(sat_solver *, Cnf_Dat_t *, Vec_Int_t *, int, int, int)");
}

Assistant:

int Acb_NtkWindow2Solver( sat_solver * pSat, Cnf_Dat_t * pCnf, Vec_Int_t * vFlip, int PivotVar, int nDivs, int nTimes )
{
    int n, i, RetValue, Test = pCnf->pClauses[0][0];
    int nGroups = nTimes <= 2 ? nTimes-1 : 2;
    int nRounds = nTimes <= 2 ? nTimes-1 : nTimes;
    assert( sat_solver_nvars(pSat) == 0 );
    sat_solver_setnvars( pSat, nTimes * pCnf->nVars + nGroups * nDivs + 2 );
    assert( nTimes == 1 || nTimes == 2 || nTimes == 6 );
    for ( n = 0; n < nTimes; n++ )
    {
        if ( n & 1 )
            Cnf_DataLiftAndFlipLits( pCnf, -pCnf->nVars, vFlip );
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
                printf( "Error: SAT solver became UNSAT at a wrong place.\n" );
        if ( n & 1 )
            Cnf_DataLiftAndFlipLits( pCnf, pCnf->nVars, vFlip );
        if ( n < nTimes - 1 )
            Cnf_DataLift( pCnf, pCnf->nVars );
        else if ( n ) // if ( n == nTimes - 1 )
            Cnf_DataLift( pCnf, -(nTimes - 1) * pCnf->nVars );
    }
    assert( Test == pCnf->pClauses[0][0] );
    // add conditional buffers
    for ( n = 0; n < nRounds; n++ )
    {
        int BaseA = n * pCnf->nVars;
        int BaseB = ((n + 1) % nTimes) * pCnf->nVars;
        int BaseC = nTimes * pCnf->nVars + (n & 1) * nDivs;
        for ( i = 0; i < nDivs; i++ )
            sat_solver_add_buffer_enable( pSat, BaseA + i, BaseB + i, BaseC + i, 0 );
    }
    // finalize
    RetValue = sat_solver_simplify( pSat );
    if ( !RetValue ) printf( "Error: SAT solver became UNSAT at a wrong place.\n" );
    return 1;
}